

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::on_addListButton_clicked(MidiPlayerDialog *this)

{
  QSettings *pQVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Master *this_00;
  undefined1 local_1d0 [8];
  QString s;
  QTextStream local_1b0 [4];
  int row;
  QTextStream listStream;
  QFlags<QIODeviceBase::OpenModeFlag> local_19c;
  QFile local_198 [8];
  QFile listFile;
  QVariant local_188;
  QString local_168;
  QDir local_150 [8];
  QString local_148;
  undefined4 local_130;
  Int local_12c;
  QString local_128;
  QString local_110;
  undefined1 local_f8 [8];
  QString fileName;
  QString local_c0;
  QVariant local_a8;
  QFlag local_88;
  QFlags<QFileDialog::Option> local_84;
  undefined1 local_80 [4];
  Options qFileDialogOptions;
  QString local_50;
  QVariant local_38;
  QSettings *local_18;
  QSettings *settings;
  MidiPlayerDialog *this_local;
  
  settings = (QSettings *)this;
  this_00 = Master::getInstance();
  local_18 = Master::getSettings(this_00);
  if ((on_addListButton_clicked()::currentDir == '\0') &&
     (iVar4 = __cxa_guard_acquire(&on_addListButton_clicked()::currentDir), pQVar1 = local_18,
     iVar4 != 0)) {
    QString::QString(&local_50,"Master/LastAddMidiFileListDir");
    QVariant::QVariant((QVariant *)local_80);
    QSettings::value((QString *)&local_38,(QVariant *)pQVar1);
    QVariant::toString();
    QVariant::~QVariant(&local_38);
    QVariant::~QVariant((QVariant *)local_80);
    QString::~QString(&local_50);
    __cxa_atexit(QString::~QString,&on_addListButton_clicked::currentDir,&__dso_handle);
    __cxa_guard_release(&on_addListButton_clicked()::currentDir);
  }
  pQVar1 = local_18;
  QString::QString(&local_c0,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&fileName.d.size,0);
  QSettings::value((QString *)&local_a8,(QVariant *)pQVar1);
  iVar4 = QVariant::toInt((bool *)&local_a8);
  QFlag::QFlag(&local_88,iVar4);
  QFlags<QFileDialog::Option>::QFlags(&local_84,local_88);
  QVariant::~QVariant(&local_a8);
  QVariant::~QVariant((QVariant *)&fileName.d.size);
  QString::~QString(&local_c0);
  QString::QString(&local_110,(char *)0x0);
  QString::QString(&local_128,"Play list files (*.*)");
  local_12c = local_84.i;
  QFileDialog::getOpenFileName
            ((QWidget *)local_f8,(QString *)this,(QString *)&local_110,
             (QString *)&on_addListButton_clicked::currentDir,(QString *)&local_128,
             (QFlags_conflict1 *)0x0);
  QString::~QString(&local_128);
  QString::~QString(&local_110);
  bVar2 = QString::isEmpty((QString *)local_f8);
  if (bVar2) {
    local_130 = 1;
  }
  else {
    QDir::QDir(local_150,(QString *)local_f8);
    QDir::absolutePath();
    QString::operator=(&on_addListButton_clicked::currentDir,&local_148);
    QString::~QString(&local_148);
    QDir::~QDir(local_150);
    pQVar1 = local_18;
    QString::QString(&local_168,"Master/LastAddMidiFileListDir");
    QVariant::QVariant(&local_188,(QString *)&on_addListButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar1,(QVariant *)&local_168);
    QVariant::~QVariant(&local_188);
    QString::~QString(&local_168);
    QFile::QFile(local_198,(QString *)local_f8);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_19c,ReadOnly);
    bVar3 = QFile::open((QFlags_conflict1 *)local_198);
    if ((bVar3 & 1) == 0) {
      local_130 = 1;
    }
    else {
      QTextStream::QTextStream(local_1b0,(QIODevice *)local_198);
      s.d.size._4_4_ = QListWidget::currentRow();
      while (bVar3 = QTextStream::atEnd(), ((bVar3 ^ 0xff) & 1) != 0) {
        QTextStream::readLine((longlong)local_1d0);
        bVar2 = QString::isEmpty((QString *)local_1d0);
        if (bVar2) {
          local_130 = 2;
        }
        else {
          s.d.size._4_4_ = s.d.size._4_4_ + 1;
          QListWidget::insertItem
                    ((int)*(undefined8 *)(this->ui + 0x18),(QString *)(ulong)s.d.size._4_4_);
          local_130 = 0;
        }
        QString::~QString((QString *)local_1d0);
      }
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      updateCurrentItem(this);
      QTextStream::~QTextStream(local_1b0);
      local_130 = 0;
    }
    QFile::~QFile(local_198);
  }
  QString::~QString((QString *)local_f8);
  return;
}

Assistant:

void MidiPlayerDialog::on_addListButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileListDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getOpenFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (fileName.isEmpty()) return;
	currentDir = QDir(fileName).absolutePath();
	settings->setValue("Master/LastAddMidiFileListDir", currentDir);
	QFile listFile(fileName);
	if (!listFile.open(QIODevice::ReadOnly)) return;
	QTextStream listStream(&listFile);
	int row = ui->playList->currentRow();
	while (!listStream.atEnd()) {
		QString s = listStream.readLine();
		if (s.isEmpty()) continue;
		ui->playList->insertItem(++row, s);
	}
	ui->playList->setCurrentRow(row);
	updateCurrentItem();
}